

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_division
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis,
          vec<16U,_float> *centroid,weighted_vec_array *vecs,vector<unsigned_int> *indices,
          vector<unsigned_int> *left_indices,vector<unsigned_int> *right_indices)

{
  vector<unsigned_int> *this_00;
  uint i;
  ulong uVar1;
  float fVar2;
  vec<16U,_float> v;
  uint local_7c;
  weighted_vec_array *local_78;
  vec<16U,_float> local_70;
  
  local_78 = vecs;
  vector<unsigned_int>::resize(left_indices,0,false);
  vector<unsigned_int>::resize(right_indices,0,false);
  for (uVar1 = 0; uVar1 < indices->m_size; uVar1 = uVar1 + 1) {
    local_7c = indices->m_p[uVar1];
    operator-(&local_78->m_p[local_7c].m_vec,centroid);
    fVar2 = operator*(&local_70,axis);
    this_00 = right_indices;
    if (fVar2 < 0.0) {
      this_00 = left_indices;
    }
    vector<unsigned_int>::push_back(this_00,&local_7c);
  }
  return;
}

Assistant:

void compute_division(
            const VectorType& axis, const VectorType& centroid, const weighted_vec_array& vecs, const vector<uint>& indices,
            vector<uint>& left_indices,
            vector<uint>& right_indices)
        {
            left_indices.resize(0);
            right_indices.resize(0);

            for (uint i = 0; i < indices.size(); i++)
            {
                const uint vec_index = indices[i];
                const VectorType v(vecs[vec_index].m_vec - centroid);

                float t = v * axis;
                if (t < 0.0f)
                {
                    left_indices.push_back(vec_index);
                }
                else
                {
                    right_indices.push_back(vec_index);
                }
            }
        }